

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_print.cc
# Opt level: O0

int X509_NAME_print_ex_fp(FILE *fp,X509_NAME *nm,int indent,ulong flags)

{
  BIO *pBStack_38;
  int ret;
  BIO *bio;
  unsigned_long flags_local;
  int indent_local;
  X509_NAME *nm_local;
  FILE *fp_local;
  
  pBStack_38 = (BIO *)0x0;
  if ((fp == (FILE *)0x0) || (pBStack_38 = BIO_new_fp(fp,0), pBStack_38 != (BIO *)0x0)) {
    fp_local._4_4_ = X509_NAME_print_ex(pBStack_38,nm,indent,flags);
    BIO_free(pBStack_38);
  }
  else {
    fp_local._4_4_ = -1;
  }
  return fp_local._4_4_;
}

Assistant:

int X509_NAME_print_ex_fp(FILE *fp, const X509_NAME *nm, int indent,
                          unsigned long flags) {
  BIO *bio = NULL;
  if (fp != NULL) {
    // If |fp| is NULL, this function returns the number of bytes without
    // writing.
    bio = BIO_new_fp(fp, BIO_NOCLOSE);
    if (bio == NULL) {
      return -1;
    }
  }
  int ret = X509_NAME_print_ex(bio, nm, indent, flags);
  BIO_free(bio);
  return ret;
}